

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_4,_4> * __thiscall
tcu::transpose<float,4,4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,tcu *this,Matrix<float,_4,_4> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_24;
  undefined4 local_20;
  int col;
  int row;
  Matrix<float,_4,_4> *mat_local;
  Matrix<float,_4,_4> *res;
  
  Matrix<float,_4,_4>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pfVar2 = Matrix<float,_4,_4>::operator()((Matrix<float,_4,_4> *)this,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_4,_4>::operator()(__return_storage_ptr__,local_24,local_20);
      *pfVar2 = fVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}